

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::ParamSpec::MergePartialFromCodedStream(ParamSpec *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  int iVar3;
  WireType WVar4;
  pair<unsigned_int,_bool> pVar5;
  string *value_00;
  char *data;
  UnknownFieldSet *pUVar6;
  bool local_89;
  ParamSpec_DimCheckMode local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  ParamSpec *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x10000328 = input;
LAB_00767a5b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
       (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
       '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar5 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                              (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar5 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    local_74 = local_10;
    p.first = local_74;
    if ((uStack_c & 1) == 0) goto switchD_00767c72_default;
    iVar3 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    pCVar1 = stack0xffffffffffffff98;
    switch(iVar3) {
    case 1:
      if ((p.first & 0xff) == 10) {
        value_00 = mutable_name_abi_cxx11_(this);
        bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,value_00);
        if (!bVar2) {
          return false;
        }
        name_abi_cxx11_(this);
        data = (char *)std::__cxx11::string::data();
        name_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (data,iVar3,PARSE,"caffe.ParamSpec.name");
        goto LAB_00767a5b;
      }
      break;
    case 2:
      if ((p.first & 0xff) == 0x10) {
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_78);
        if (!bVar2) {
          return false;
        }
        bVar2 = ParamSpec_DimCheckMode_IsValid(local_78);
        if (bVar2) {
          set_share_mode(this,local_78);
        }
        else {
          pUVar6 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint(pUVar6,2,(long)(int)local_78);
        }
        goto LAB_00767a5b;
      }
      break;
    case 3:
      if ((p.first & 0xff) != 0x1d) break;
      set_has_lr_mult(this);
      bVar2 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (stack0xffffffffffffff98,&this->lr_mult_);
      goto joined_r0x00767dc5;
    case 4:
      if ((p.first & 0xff) == 0x25) {
        set_has_decay_mult(this);
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (stack0xffffffffffffff98,&this->decay_mult_);
        goto joined_r0x00767dc5;
      }
    }
switchD_00767c72_default:
    if ((p.first == 0) ||
       (WVar4 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
       pCVar1 = stack0xffffffffffffff98, tag_00 = p.first, WVar4 == WIRETYPE_END_GROUP)) {
      return true;
    }
    pUVar6 = mutable_unknown_fields(this);
    bVar2 = google::protobuf::internal::WireFormat::SkipField(pCVar1,tag_00,pUVar6);
joined_r0x00767dc5:
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool ParamSpec::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ParamSpec)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ParamSpec.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ParamSpec.DimCheckMode share_mode = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::ParamSpec_DimCheckMode_IsValid(value)) {
            set_share_mode(static_cast< ::caffe::ParamSpec_DimCheckMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float lr_mult = 3 [default = 1];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_lr_mult();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &lr_mult_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float decay_mult = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {
          set_has_decay_mult();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &decay_mult_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ParamSpec)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ParamSpec)
  return false;
#undef DO_
}